

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civil_time_detail.h
# Opt level: O0

civil_day __thiscall
absl::lts_20240722::time_internal::cctz::detail::next_weekday(detail *this,civil_day cd,weekday wd)

{
  civil_time<absl::lts_20240722::time_internal::cctz::detail::day_tag> a;
  fields fVar1;
  uint local_88;
  uint local_84;
  int j;
  int i;
  weekday local_6c;
  weekday local_68;
  weekday base;
  weekday k_weekdays_forw [14];
  undefined1 auStack_28 [4];
  weekday wd_local;
  civil_day cd_local;
  
  cd_local.f_.y = cd.f_.y;
  k_weekdays_forw[0xd] = cd.f_._8_4_;
  _auStack_28 = this;
  memcpy(&local_68,&DAT_00147610,0x38);
  civil_time<absl::lts_20240722::time_internal::cctz::detail::second_tag>::
  civil_time<absl::lts_20240722::time_internal::cctz::detail::day_tag>
            ((civil_time<absl::lts_20240722::time_internal::cctz::detail::second_tag> *)&j,
             (civil_time<absl::lts_20240722::time_internal::cctz::detail::day_tag> *)auStack_28,
             (preserves_data<absl::lts_20240722::time_internal::cctz::detail::second_tag,_absl::lts_20240722::time_internal::cctz::detail::day_tag>
              *)0x0);
  local_6c = get_weekday((civil_second *)&j);
  for (local_84 = 0; local_88 = local_84, local_6c != (&local_68)[(int)local_84];
      local_84 = local_84 + 1) {
  }
  do {
    local_88 = local_88 + 1;
  } while (k_weekdays_forw[0xd] != (&local_68)[(int)local_88]);
  a.f_._8_8_ = (long)(int)(local_88 - local_84);
  a.f_.y = cd_local.f_.y;
  fVar1 = (fields)operator+(_auStack_28,a,(ulong)local_84);
  return (civil_day)fVar1;
}

Assistant:

CONSTEXPR_F civil_day next_weekday(civil_day cd, weekday wd) noexcept {
  CONSTEXPR_D weekday k_weekdays_forw[14] = {
      weekday::monday,    weekday::tuesday,  weekday::wednesday,
      weekday::thursday,  weekday::friday,   weekday::saturday,
      weekday::sunday,    weekday::monday,   weekday::tuesday,
      weekday::wednesday, weekday::thursday, weekday::friday,
      weekday::saturday,  weekday::sunday,
  };
  weekday base = get_weekday(cd);
  for (int i = 0;; ++i) {
    if (base == k_weekdays_forw[i]) {
      for (int j = i + 1;; ++j) {
        if (wd == k_weekdays_forw[j]) {
          return cd + (j - i);
        }
      }
    }
  }
}